

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O2

void Eigen::internal::
     generic_product_impl<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,-1,1,0,-1,1>const>,1>,Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,1,true>const,Eigen::DenseShape,Eigen::DenseShape,7>
     ::scaleAndAddTo<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>>
               (Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *dst,
               Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>
               *lhs,Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *rhs,
               Scalar *alpha)

{
  float fVar1;
  float *pfVar2;
  ReturnType RVar3;
  LhsNested actual_lhs;
  RhsNested actual_rhs;
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>
  local_c0 [2];
  undefined1 local_88 [48];
  XprTypeNested local_58;
  
  local_c0[0].m_lhs.m_xpr.m_matrix = (lhs->m_lhs).m_xpr.m_matrix;
  if (((local_c0[0].m_lhs.m_xpr.m_matrix)->
      super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols == 1) {
    fVar1 = *alpha;
    Block<const_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>,_1,_-1,_true>
    ::Block((Block<const_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true>
             *)local_c0,lhs,0);
    BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_true,_true>
    ::BlockImpl_dense((BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_true,_true>
                       *)local_88,rhs,0);
    RVar3 = MatrixBase<Eigen::Block<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,-1,1,0,-1,1>const>,1>const,1,-1,true>>
            ::
            dot<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,true>const,_1,1,true>>
                      ((MatrixBase<Eigen::Block<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>const,1,_1,true>>
                        *)local_c0,
                       (MatrixBase<Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_true>_>
                        *)local_88);
    pfVar2 = (dst->
             super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>).
             super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
             m_data;
    *pfVar2 = RVar3 * fVar1 + *pfVar2;
  }
  else {
    local_c0[0].m_rhs.m_diagonal = (lhs->m_rhs).m_diagonal;
    local_58 = (XprTypeNested)
               (rhs->
               super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
               ).
               super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
               .m_outerStride;
    local_88._0_8_ =
         (rhs->
         super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>).
         super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
         super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
         m_data;
    local_88._8_8_ =
         (rhs->
         super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>).
         super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
         super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
         m_rows.m_value;
    local_88._16_8_ =
         *(undefined8 *)
          &(rhs->
           super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
           ).super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
           .
           super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
           .field_0x10;
    local_88._24_8_ =
         (rhs->
         super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>).
         super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
         m_xpr;
    local_88._32_8_ =
         (rhs->
         super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>).
         super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
         m_startRow.m_value;
    local_88._40_8_ =
         (rhs->
         super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>).
         super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
         m_startCol.m_value;
    gemv_dense_selector<2,1,false>::
    run<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,true>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>>
              (local_c0,(Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *)
                        local_88,dst,alpha);
  }
  return;
}

Assistant:

static EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void scaleAndAddTo(Dest& dst, const Lhs& lhs, const Rhs& rhs, const Scalar& alpha)
  {
    // Fallback to inner product if both the lhs and rhs is a runtime vector.
    if (lhs.rows() == 1 && rhs.cols() == 1) {
      dst.coeffRef(0,0) += alpha * lhs.row(0).conjugate().dot(rhs.col(0));
      return;
    }
    LhsNested actual_lhs(lhs);
    RhsNested actual_rhs(rhs);
    internal::gemv_dense_selector<Side,
                            (int(MatrixType::Flags)&RowMajorBit) ? RowMajor : ColMajor,
                            bool(internal::blas_traits<MatrixType>::HasUsableDirectAccess)
                           >::run(actual_lhs, actual_rhs, dst, alpha);
  }